

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_owner_parse.c
# Opt level: O0

int int_in_list(int i,int *l,size_t n)

{
  int iVar1;
  size_t local_20;
  size_t n_local;
  int *l_local;
  int i_local;
  
  local_20 = n;
  n_local = (size_t)l;
  do {
    if (local_20 == 0) {
      failure("%d",(ulong)(uint)i);
      return 0;
    }
    iVar1 = *(int *)n_local;
    local_20 = local_20 - 1;
    n_local = n_local + 4;
  } while (iVar1 != i);
  return 1;
}

Assistant:

static int
int_in_list(int i, const int *l, size_t n)
{
	while (n-- > 0)
		if (*l++ == i)
			return (1);
	failure("%d", i);
	return (0);
}